

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall ON_PointCloud::Transform(ON_PointCloud *this,ON_Xform *xform)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_Xform *xform_local;
  ON_PointCloud *this_local;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  local_19 = ON_3dPointArray::Transform(&this->m_P,xform);
  if ((local_19) && (bVar1 = HasPlane(this), bVar1)) {
    local_19 = ON_Plane::Transform(&this->m_plane,xform);
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  return local_19;
}

Assistant:

bool ON_PointCloud::Transform( 
       const ON_Xform& xform
       )
{
  TransformUserData(xform);
  bool rc = m_P.Transform(xform);
  if (rc && HasPlane() )
    rc = m_plane.Transform(xform);
  m_bbox.Destroy();
  return rc;
}